

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxBasisBase(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,TYPE ttype)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  Timer *pTVar2;
  
  this->_vptr_SPxBasisBase = (_func_int **)&PTR_change_003b2348;
  this->theLP = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0;
  (this->theBaseId).data = (SPxId *)0x0;
  (this->theBaseId).memFactor = 1.2;
  (this->theBaseId).thesize = 0;
  (this->theBaseId).themax = 1;
  spx_alloc<soplex::SPxId*>(&(this->theBaseId).data,1);
  (this->matrix).data =
       (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)0x0;
  (this->matrix).memFactor = 1.2;
  (this->matrix).thesize = 0;
  (this->matrix).themax = 1;
  spx_alloc<soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>const**>
            (&(this->matrix).data,1);
  this->matrixIsSetup = false;
  this->factor = (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0;
  this->factorized = false;
  this->maxUpdates = 200;
  (this->nonzeroFactor).m_backend.fpclass = cpp_dec_float_finite;
  (this->nonzeroFactor).m_backend.prec_elem = 10;
  (this->nonzeroFactor).m_backend.data._M_elems[0] = 0;
  (this->nonzeroFactor).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->nonzeroFactor).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &(this->nonzeroFactor).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->nonzeroFactor).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->nonzeroFactor).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->nonzeroFactor).m_backend.data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&this->nonzeroFactor,10.0);
  (this->fillFactor).m_backend.fpclass = cpp_dec_float_finite;
  (this->fillFactor).m_backend.prec_elem = 10;
  (this->fillFactor).m_backend.data._M_elems[0] = 0;
  (this->fillFactor).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->fillFactor).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &(this->fillFactor).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->fillFactor).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->fillFactor).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->fillFactor).m_backend.data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&this->fillFactor,5.0);
  (this->memFactor).m_backend.fpclass = cpp_dec_float_finite;
  (this->memFactor).m_backend.prec_elem = 10;
  (this->memFactor).m_backend.data._M_elems[0] = 0;
  (this->memFactor).m_backend.data._M_elems[1] = 0;
  pcVar1 = &(this->memFactor).m_backend;
  (pcVar1->data)._M_elems[2] = 0;
  (pcVar1->data)._M_elems[3] = 0;
  pcVar1 = &(this->memFactor).m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  pcVar1 = &(this->memFactor).m_backend;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(this->memFactor).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(this->memFactor).m_backend.data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&this->memFactor,1.5);
  this->iterCount = 0;
  this->lastIterCount = 0;
  this->iterDegenCheck = 0;
  this->updateCount = 0;
  this->totalUpdateCount = 0;
  this->nzCount = 1;
  this->lastMem = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&(this->lastFill).m_backend,0,(type *)0x0);
  this->lastNzCount = 0;
  this->theTime = (Timer *)0x0;
  this->timerType = ttype;
  (this->lastin).super_DataKey = (DataKey)0xffffffff00000000;
  (this->lastout).super_DataKey = (DataKey)0xffffffff00000000;
  (this->minStab).m_backend.fpclass = cpp_dec_float_finite;
  (this->minStab).m_backend.prec_elem = 10;
  this->lastidx = 0;
  (this->minStab).m_backend.data._M_elems[0] = 0;
  pcVar1 = &(this->minStab).m_backend;
  (pcVar1->data)._M_elems[1] = 0;
  (pcVar1->data)._M_elems[2] = 0;
  pcVar1 = &(this->minStab).m_backend;
  (pcVar1->data)._M_elems[3] = 0;
  (pcVar1->data)._M_elems[4] = 0;
  pcVar1 = &(this->minStab).m_backend;
  (pcVar1->data)._M_elems[5] = 0;
  (pcVar1->data)._M_elems[6] = 0;
  pcVar1 = &(this->minStab).m_backend;
  (pcVar1->data)._M_elems[7] = 0;
  (pcVar1->data)._M_elems[8] = 0;
  *(undefined8 *)((this->minStab).m_backend.data._M_elems + 9) = 0;
  (this->minStab).m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&this->minStab,0.0);
  this->thestatus = NO_PROBLEM;
  Desc::Desc(&this->thedesc);
  this->freeSlinSolver = false;
  this->spxout = (SPxOut *)0x0;
  pTVar2 = TimerFactory::createTimer(this->timerType);
  this->theTime = pTVar2;
  return;
}

Assistant:

SPxBasisBase<R>::SPxBasisBase(Timer::TYPE ttype)
   : theLP(nullptr)
   , matrixIsSetup(false)
   , factor(nullptr)
   , factorized(false)
   , maxUpdates(200)
   , nonzeroFactor(10.0)
   , fillFactor(5.0)
   , memFactor(1.5)
   , iterCount(0)
   , lastIterCount(0)
   , iterDegenCheck(0)
   , updateCount(0)
   , totalUpdateCount(0)
   , nzCount(1)
   , lastMem(0)
   , lastFill(0)
   , lastNzCount(0)
   , theTime(nullptr)
   , timerType(ttype)
   , lastidx(0)
   , minStab(0.0)
   , thestatus(NO_PROBLEM)
   , freeSlinSolver(false)
   , spxout(nullptr)
{
   // info: is not consistent at this moment, e.g. because theLP == 0

   theTime = TimerFactory::createTimer(timerType);
}